

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O2

bool __thiscall
OIS::LinuxInputManager::vendorExist(LinuxInputManager *this,Type iType,string *vendor)

{
  bool bVar1;
  __type _Var2;
  pointer pJVar3;
  bool bVar4;
  
  if (iType - OISKeyboard < 2) {
    _Var2 = std::operator==(vendor,&(this->super_InputManager).mInputSystemName);
    if (_Var2) {
      return this->window != 0;
    }
  }
  else if (iType == OISJoyStick) {
    pJVar3 = (this->unusedJoyStickList).
             super__Vector_base<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      bVar4 = pJVar3 == (this->unusedJoyStickList).
                        super__Vector_base<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      bVar1 = !bVar4;
      if (bVar4) {
        return bVar1;
      }
      _Var2 = std::operator==(&pJVar3->vendor,vendor);
      pJVar3 = pJVar3 + 1;
    } while (!_Var2);
    return bVar1;
  }
  return false;
}

Assistant:

bool LinuxInputManager::vendorExist(Type iType, const std::string& vendor)
{
	if((iType == OISKeyboard || iType == OISMouse) && vendor == mInputSystemName)
	{
		return window ? true : false;
	}
	else if(iType == OISJoyStick)
	{
		for(JoyStickInfoList::iterator i = unusedJoyStickList.begin(); i != unusedJoyStickList.end(); ++i)
			if(i->vendor == vendor)
				return true;
	}

	return false;
}